

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::basic_string_view<char>,_char[3]>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>,char_const[3]>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::basic_string_view<char>,_char[3]>
           *__return_storage_ptr__,v10 *this,basic_string_view<char> *args,char (*args_1) [3])

{
  size_t sVar1;
  basic_string_view<char> s;
  char (*args_local_1) [3];
  basic_string_view<char> *args_local;
  undefined1 local_e9;
  char *local_e8;
  size_t local_e0;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_d0;
  bool formattable_char;
  char *local_c8 [3];
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  size_t local_a0;
  detail *local_78;
  char *pcStack_70;
  v10 *local_60;
  undefined1 *local_58;
  basic_string_view<char> local_50;
  char **local_40;
  basic_string_view<char> local_38 [3];
  
  local_d1 = 1;
  local_d2 = 1;
  local_d3 = 1;
  local_58 = &local_e9;
  local_78 = *(detail **)this;
  pcStack_70 = *(char **)(this + 8);
  s.size_ = (size_t)args;
  s.data_ = pcStack_70;
  pvStack_d0 = this;
  local_60 = this;
  local_50 = detail::to_string_view<char>(local_78,s);
  local_e8 = local_50.data_;
  local_e0 = local_50.size_;
  local_38[0].data_ = local_50.data_;
  local_38[0].size_ = local_50.size_;
  local_40 = local_c8;
  local_c8[0] = basic_string_view<char>::data(local_38);
  sVar1 = basic_string_view<char>::size(local_38);
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_c8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.named_args.data = (named_arg_info<char> *)args;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_a0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}